

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O1

void deqp::gles3::Functional::eval_selection_ivec3(ShaderEvalContext *c)

{
  float fVar1;
  int i;
  long lVar2;
  Vector<int,_3> *pVVar3;
  Vector<int,_3> res_1;
  Vector<int,_3> res;
  Vector<float,_3> res_2;
  float local_3c [3];
  undefined8 local_30;
  int local_28;
  undefined8 local_24;
  float local_1c;
  int local_18 [6];
  
  fVar1 = c->in[0].m_data[2];
  local_24 = *(undefined8 *)(c->in[1].m_data + 1);
  local_1c = c->in[1].m_data[0];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  lVar2 = 0;
  do {
    res.m_data[lVar2] = (int)*(float *)((long)&local_24 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_3c[0] = c->in[2].m_data[3];
  local_3c[1] = c->in[2].m_data[1];
  local_3c[2] = c->in[2].m_data[2];
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  res_1.m_data[2] = 0;
  lVar2 = 0;
  do {
    res_1.m_data[lVar2] = (int)local_3c[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  pVVar3 = &res_1;
  if (0.0 < fVar1) {
    pVVar3 = &res;
  }
  local_28 = pVVar3->m_data[2];
  local_30 = *(undefined8 *)pVVar3->m_data;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  lVar2 = 0;
  do {
    res_2.m_data[lVar2] = (float)*(int *)((long)&local_30 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_18[2] = 0;
  local_18[3] = 1;
  local_18[4] = 2;
  lVar2 = 2;
  do {
    (c->color).m_data[local_18[lVar2]] = (float)res.m_data[lVar2 + 2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

void eval_selection_ivec3	(ShaderEvalContext& c) { c.color.xyz()	= selection(c.in[0].z() > 0.0f,			c.in[1].swizzle(1, 2, 0).asInt(),		c.in[2].swizzle(3, 1, 2).asInt()).asFloat(); }